

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

void Wlc_NtkAbsCreateFlopInputs
               (Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,Vec_Int_t *vNodeFrames,Vec_Int_t *vFanins,
               Vec_Int_t *vNewObjs,Wlc_Obj_t *pCounter,int AdderBits)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Wlc_Obj_t *pObj;
  Wlc_Obj_t *pWVar5;
  Wlc_Obj_t *pWVar6;
  Wlc_Obj_t *pWVar7;
  Wlc_Obj_t *pObj_00;
  int iVar8;
  int iVar9;
  int i;
  int iVar10;
  
  iVar4 = 0;
  i = 0;
  do {
    if (vNodeFrames->nSize <= i) {
      return;
    }
    uVar2 = Vec_IntEntry(vNodeFrames,i);
    pObj = Wlc_NtkObj(p,(int)uVar2 >> 0xb);
    for (iVar10 = 0; iVar10 != 2; iVar10 = iVar10 + 1) {
      iVar3 = Vec_IntEntry(vNewObjs,iVar4 + iVar10);
      pWVar5 = Wlc_NtkObj(pNew,iVar3);
      uVar1 = *(ushort *)pObj & 0x3f;
      if (uVar1 == 8) {
        if (iVar10 == 0) {
          pWVar6 = Wlc_ObjFanin0(p,pObj);
          pWVar6 = Wlc_ObjCopyObj(pNew,p,pWVar6);
          if ((uVar2 & 1) != 0) {
            Vec_IntFill(vFanins,1,(int)(((long)pWVar6 - (long)pNew->pObjs) / 0x18));
            iVar3 = Wlc_ObjAlloc(pNew,0xf,0,0,0);
            pWVar6 = Wlc_NtkObj(pNew,iVar3);
            Wlc_ObjAddFanins(pNew,pWVar6,vFanins);
          }
          goto LAB_003027ea;
        }
      }
      else {
        if (uVar1 == 0x36) {
          if (iVar10 != 0) {
            iVar3 = Vec_IntEntry(&p->vCopies,(int)uVar2 >> 0xb);
            pWVar6 = Wlc_NtkObj(pNew,iVar3);
            goto LAB_003027ea;
          }
LAB_003027d7:
          pWVar6 = Wlc_ObjFanin1(p,pObj);
        }
        else {
          if (uVar1 != 0x37) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                          ,0x183,
                          "void Wlc_NtkAbsCreateFlopInputs(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Wlc_Obj_t *, int)"
                         );
          }
          if (iVar10 == 0) goto LAB_003027d7;
          pWVar6 = Wlc_ObjFanin2(p,pObj);
        }
        pWVar6 = Wlc_ObjCopyObj(pNew,p,pWVar6);
LAB_003027ea:
        iVar8 = pWVar5->End - pWVar5->Beg;
        iVar3 = -iVar8;
        if (0 < iVar8) {
          iVar3 = iVar8;
        }
        iVar9 = pWVar6->End - pWVar6->Beg;
        iVar8 = -iVar9;
        if (0 < iVar9) {
          iVar8 = iVar9;
        }
        if (iVar3 != iVar8) {
          __assert_fail("Wlc_ObjRange(pFlop) == Wlc_ObjRange(pFanin)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                        ,0x184,
                        "void Wlc_NtkAbsCreateFlopInputs(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Wlc_Obj_t *, int)"
                       );
        }
        iVar3 = Wlc_ObjAlloc(pNew,6,0,AdderBits + -1,0);
        pWVar7 = Wlc_NtkObj(pNew,iVar3);
        Vec_IntFill(vFanins,1,uVar2 >> 1 & 0x3ff);
        Wlc_ObjAddFanins(pNew,pWVar7,vFanins);
        iVar3 = Wlc_ObjAlloc(pNew,0x1f,0,0,0);
        pObj_00 = Wlc_NtkObj(pNew,iVar3);
        Vec_IntFillTwo(vFanins,2,(int)(((long)pWVar7 - (long)pNew->pObjs) / 0x18),
                       (int)(((long)pCounter - (long)pNew->pObjs) / 0x18));
        Wlc_ObjAddFanins(pNew,pObj_00,vFanins);
        iVar8 = pWVar5->End - pWVar5->Beg;
        iVar3 = -iVar8;
        if (0 < iVar8) {
          iVar3 = iVar8;
        }
        iVar3 = Wlc_ObjAlloc(pNew,8,0,iVar3,0);
        pWVar7 = Wlc_NtkObj(pNew,iVar3);
        vFanins->nSize = 0;
        Vec_IntPush(vFanins,(int)(((long)pObj_00 - (long)pNew->pObjs) / 0x18));
        Vec_IntPush(vFanins,(int)(((long)pWVar5 - (long)pNew->pObjs) / 0x18));
        Vec_IntPush(vFanins,(int)(((long)pWVar6 - (long)pNew->pObjs) / 0x18));
        Wlc_ObjAddFanins(pNew,pWVar7,vFanins);
        Wlc_ObjSetCo(pNew,pWVar7,1);
      }
    }
    i = i + 1;
    iVar4 = iVar4 + 2;
  } while( true );
}

Assistant:

void Wlc_NtkAbsCreateFlopInputs( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, Vec_Int_t * vNodeFrames, Vec_Int_t * vFanins, Vec_Int_t * vNewObjs, Wlc_Obj_t * pCounter, int AdderBits ) 
{
    Wlc_Obj_t * pObj, * pFanin, * pFlop, * pCond, * pMux, * pConst;
    int i, n, Entry, Value, iObj, iFrame;
    Vec_IntForEachEntry( vNodeFrames, Entry, i )
    {
        Value  = Entry & 1;
        iObj   = Entry >> 11;
        iFrame = (Entry >> 1) & 0x3FF;
        pObj   = Wlc_NtkObj( p, iObj );
        for ( n = 0; n < 2; n++ ) // n=0 -- address   n=1 -- data
        {
            pFlop = Wlc_NtkObj( pNew, Vec_IntEntry(vNewObjs, 2*i+n) );
            if ( Wlc_ObjType(pObj) == WLC_OBJ_WRITE )
                pFanin = Wlc_ObjCopyObj( pNew, p, n ? Wlc_ObjFanin2(p, pObj) : Wlc_ObjFanin1(p, pObj) );
            else if ( Wlc_ObjType(pObj) == WLC_OBJ_READ )
                pFanin = n ? Wlc_NtkObj(pNew, Wlc_ObjCopy(p, iObj)) : Wlc_ObjCopyObj( pNew, p, Wlc_ObjFanin1(p, pObj) );
            else if ( Wlc_ObjType(pObj) == WLC_OBJ_MUX )
            {
                if ( n ) continue;
                pFanin = Wlc_ObjCopyObj( pNew, p, Wlc_ObjFanin0(p, pObj) );
                if ( Value )
                {
                    Vec_IntFill( vFanins, 1, Wlc_ObjId(pNew, pFanin) );
                    pFanin = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_BIT_NOT, 0, 0, 0));
                    Wlc_ObjAddFanins( pNew, pFanin, vFanins );
                }
            }
            else assert( 0 );
            assert( Wlc_ObjRange(pFlop) == Wlc_ObjRange(pFanin) );
            // create constant
            pConst = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_CONST, 0, AdderBits-1, 0));
            Vec_IntFill( vFanins, 1, iFrame );
            Wlc_ObjAddFanins( pNew, pConst, vFanins );
            // create equality
            pCond = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_COMP_EQU, 0, 0, 0));
            Vec_IntFillTwo( vFanins, 2, Wlc_ObjId(pNew, pConst), Wlc_ObjId(pNew, pCounter) );
            Wlc_ObjAddFanins( pNew, pCond, vFanins );
            // create MUX
            pMux = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_MUX, 0, Wlc_ObjRange(pFlop)-1, 0));
            Vec_IntClear( vFanins );
            Vec_IntPush( vFanins, Wlc_ObjId(pNew, pCond) );
            Vec_IntPush( vFanins, Wlc_ObjId(pNew, pFlop) );
            Vec_IntPush( vFanins, Wlc_ObjId(pNew, pFanin) );
            Wlc_ObjAddFanins( pNew, pMux, vFanins );
            Wlc_ObjSetCo( pNew, pMux, 1 );
        }
    }
}